

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarimage.hpp
# Opt level: O0

void __thiscall ScalarImage::ScalarImage(ScalarImage *this,string *filename)

{
  undefined1 auVar1 [16];
  bool bVar2;
  float *pfVar3;
  ulong uVar4;
  void *pvVar5;
  undefined8 *puVar6;
  char (*in_RDI) [21];
  int i;
  float *raw;
  int n;
  string ext;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar7;
  int *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  suffix(in_stack_ffffffffffffffc8);
  github111116::ConsoleLogger::log<char[21],std::__cxx11::string>
            ((ConsoleLogger *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,
             in_stack_ffffffffffffffa0);
  bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (!bVar2) {
    bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar2) {
      bVar2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (!bVar2) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "ScalarImage load: unrecognized format";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
    }
  }
  std::__cxx11::string::c_str();
  pfVar3 = stbi_loadf((char *)in_stack_ffffffffffffffc8,
                      (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8,
                      (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_RDI >> 0x20));
  if (pfVar3 == (float *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "ScalarImage load failed";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)(*in_RDI + 8) * *(int *)(*in_RDI + 0xc));
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  *(void **)*in_RDI = pvVar5;
  for (iVar7 = 0; iVar7 < *(int *)(*in_RDI + 8) * *(int *)(*in_RDI + 0xc); iVar7 = iVar7 + 1) {
    *(float *)(*(long *)*in_RDI + (long)iVar7 * 4) =
         pfVar3[iVar7 * in_stack_ffffffffffffffc0 + in_stack_ffffffffffffffc0 + -1];
  }
  stbi_image_free((void *)0x195010);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

ScalarImage(const std::string& filename)
	{
		std::string ext = suffix(filename);
		console.log("Loading ScalarImage:", filename);
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			// use the last channel
			int n;
			float* raw = stbi_loadf(filename.c_str(), &w, &h, &n, 0);
			if (raw == NULL) throw "ScalarImage load failed";
			pixels = new float[w*h];
			for (int i=0; i<w*h; ++i)
				pixels[i] = raw[i*n+n-1];
			stbi_image_free(raw);
			return;
		}
		throw "ScalarImage load: unrecognized format";
	}